

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg-traversal.h
# Opt level: O1

bool wasm::
     CFGWalker<wasm::CoalesceLocals,_wasm::Visitor<wasm::CoalesceLocals,_void>,_wasm::Liveness>::
     isReturnCall(Expression *curr)

{
  Id IVar1;
  long lVar2;
  
  IVar1 = curr->_id;
  if (IVar1 == CallId) {
    lVar2 = 0x40;
  }
  else if (IVar1 == CallRefId) {
    lVar2 = 0x38;
  }
  else {
    if (IVar1 != CallIndirectId) {
      handle_unreachable("not a call",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                         ,0x1d5);
    }
    lVar2 = 0x50;
  }
  return (bool)(&curr->_id)[lVar2];
}

Assistant:

static bool isReturnCall(Expression* curr) {
    switch (curr->_id) {
      case Expression::Id::CallId:
        return curr->cast<Call>()->isReturn;
      case Expression::Id::CallIndirectId:
        return curr->cast<CallIndirect>()->isReturn;
      case Expression::Id::CallRefId:
        return curr->cast<CallRef>()->isReturn;
      default:
        WASM_UNREACHABLE("not a call");
    }
  }